

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::TestRecursion(int size,char *pattern)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  StringPiece local_170;
  Options local_160;
  StringPiece local_148;
  undefined1 local_138 [8];
  RE2 re;
  int i;
  size_t patlen;
  string local_38 [8];
  string domain;
  char *pattern_local;
  int size_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::resize((ulong)local_38);
  sVar2 = strlen(pattern);
  for (re.group_names_once_._M_once = 0; re.group_names_once_._M_once < size;
      re.group_names_once_._M_once = re.group_names_once_._M_once + 1) {
    cVar1 = pattern[(ulong)(long)re.group_names_once_._M_once % sVar2];
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    *pcVar3 = cVar1;
  }
  StringPiece::StringPiece(&local_148,"([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?");
  RE2::Options::Options(&local_160,Quiet);
  RE2::RE2((RE2 *)local_138,&local_148,&local_160);
  StringPiece::StringPiece(&local_170,(string *)local_38);
  RE2::FullMatch<>(&local_170,(RE2 *)local_138);
  RE2::~RE2((RE2 *)local_138);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void TestRecursion(int size, const char* pattern) {
  // Fill up a string repeating the pattern given
  string domain;
  domain.resize(size);
  size_t patlen = strlen(pattern);
  for (int i = 0; i < size; i++) {
    domain[i] = pattern[i % patlen];
  }
  // Just make sure it doesn't crash due to too much recursion.
  RE2 re("([a-zA-Z0-9]|-)+(\\.([a-zA-Z0-9]|-)+)*(\\.)?", RE2::Quiet);
  RE2::FullMatch(domain, re);
}